

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GreaterEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_greaterequal(NeuralNetworkLayer *this)

{
  bool bVar1;
  GreaterEqualLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_greaterequal(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_greaterequal(this);
    this_00 = (GreaterEqualLayerParams *)operator_new(0x18);
    GreaterEqualLayerParams::GreaterEqualLayerParams(this_00);
    (this->layer_).greaterequal_ = this_00;
  }
  return (GreaterEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterEqualLayerParams* NeuralNetworkLayer::mutable_greaterequal() {
  if (!has_greaterequal()) {
    clear_layer();
    set_has_greaterequal();
    layer_.greaterequal_ = new ::CoreML::Specification::GreaterEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.greaterEqual)
  return layer_.greaterequal_;
}